

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O1

int csp_eth_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort uVar1;
  void *pvVar2;
  undefined4 *addr;
  ushort uVar3;
  int iVar4;
  arp_list_entry_s *paVar5;
  ushort uVar6;
  ushort uVar7;
  bool bVar8;
  
  if ((packet->id).dst == iface->addr) {
    iVar4 = 0;
    csp_qfifo_write(packet,iface,(void *)0x0);
  }
  else {
    pvVar2 = iface->interface_data;
    csp_id_prepend(packet);
    csp_eth_tx::packet_id = csp_eth_tx::packet_id + 1;
    uVar6 = 0;
    do {
      if (packet->frame_length <= uVar6) {
        csp_buffer_free(packet);
        return 0;
      }
      addr = *(undefined4 **)((long)pvVar2 + 0x70);
      uVar3 = *(short *)((long)pvVar2 + 0x62) - 0x16;
      uVar7 = packet->frame_length - uVar6;
      if (uVar3 <= uVar7) {
        uVar7 = uVar3;
      }
      *(undefined2 *)(addr + 3) = 0xb588;
      bVar8 = arp_list == (arp_list_entry_t *)0x0;
      if (!bVar8) {
        paVar5 = arp_list;
        do {
          if (paVar5->csp_addr == (packet->id).dst) {
            *(undefined2 *)(addr + 1) = *(undefined2 *)(paVar5->mac_addr + 4);
            *addr = *(undefined4 *)paVar5->mac_addr;
            if (!bVar8) goto LAB_0010e4c2;
            break;
          }
          paVar5 = paVar5->next;
          bVar8 = paVar5 == (arp_list_entry_s *)0x0;
        } while (!bVar8);
      }
      *(undefined2 *)(addr + 1) = 0xffff;
      *addr = 0xffffffff;
LAB_0010e4c2:
      *(undefined2 *)((long)addr + 10) = *(undefined2 *)((long)pvVar2 + 0x84);
      *(undefined4 *)((long)addr + 6) = *(undefined4 *)((long)pvVar2 + 0x80);
      if (addr != (undefined4 *)0x0) {
        uVar3 = packet->frame_length;
        uVar1 = (packet->id).src;
        *(uint16_t *)((long)addr + 0xe) = csp_eth_tx::packet_id << 8 | csp_eth_tx::packet_id >> 8;
        *(ushort *)(addr + 4) = uVar1 << 8 | uVar1 >> 8;
        *(ushort *)((long)addr + 0x12) = uVar7 << 8 | uVar7 >> 8;
        *(ushort *)(addr + 5) = uVar3 << 8 | uVar3 >> 8;
      }
      memcpy((void *)((long)addr + 0x16),packet->frame_begin + (uint)uVar6,(ulong)uVar7);
      iVar4 = (**(code **)((long)pvVar2 + 0x68))(iface->driver_data,addr);
      if (iVar4 == 0) {
        if (eth_debug == true) {
          csp_hex_dump("tx",addr,(uint)uVar6 + (uint)uVar7 + 0x16);
        }
        uVar6 = uVar7 + uVar6;
      }
      else {
        iface->tx_error = iface->tx_error + 1;
      }
    } while (iVar4 == 0);
    iVar4 = -0xb;
  }
  return iVar4;
}

Assistant:

int csp_eth_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    /* Loopback */
    if (packet->id.dst == iface->addr) {
        csp_qfifo_write(packet, iface, NULL);
        return CSP_ERR_NONE;
    }

    csp_id_prepend(packet);

    static uint16_t packet_id = 0;
    packet_id++;
    uint16_t offset = 0;

    while (offset < packet->frame_length) {

        csp_eth_header_t *eth_frame = ifdata->tx_buf;

        const uint16_t seg_size_max = ifdata->tx_mtu - sizeof(csp_eth_header_t);
        uint16_t seg_size = packet->frame_length - offset;
        if (seg_size > seg_size_max) {
            seg_size = seg_size_max;
        }

        eth_frame->ether_type = htobe16(CSP_ETH_TYPE_CSP);
        csp_eth_arp_get_addr(eth_frame->ether_dhost, packet->id.dst);
        memcpy(eth_frame->ether_shost, ifdata->if_mac, CSP_ETH_ALEN);

        csp_eth_pack_header(eth_frame, packet_id, packet->id.src, seg_size, packet->frame_length);

        memcpy(eth_frame->frame_begin, packet->frame_begin + offset, seg_size);

		if ((ifdata->tx_func)(iface->driver_data, eth_frame) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
        }

        if (eth_debug) csp_hex_dump("tx", eth_frame, sizeof(csp_eth_header_t) + offset + seg_size);

        offset += seg_size;
    }

    csp_buffer_free(packet);
    return CSP_ERR_NONE;
}